

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.h
# Opt level: O0

void __thiscall
Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Clear
          (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  void *pvVar4;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_local;
  
  bVar2 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          ::ValidThreadAccess((this->super_ArenaData).pageAllocator);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.h"
                       ,0xcf,"(this->pageAllocator->ValidThreadAccess())",
                       "Arena allocation should only be used by a single thread");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (((this->super_ArenaData).lockBlockList & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.h"
                       ,0xd0,"(!lockBlockList)","!lockBlockList");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  ArenaMemoryTracking::ReportFreeAll(&this->super_Allocator);
  pvVar4 = InPlaceFreeListPolicy::Reset(this->freeList);
  this->freeList = pvVar4;
  this->freeListSize = 0;
  ReleaseMemory(this);
  (this->super_ArenaData).cacheBlockCurrent = (char *)0x0;
  TaggedPointer<char>::operator=(&this->cacheBlockEnd,(char *)0x0);
  (this->super_ArenaData).bigBlocks = (BigBlock *)0x0;
  (this->super_ArenaData).fullBlocks = (BigBlock *)0x0;
  this->largestHole = 0;
  (this->super_ArenaData).mallocBlocks = (ArenaMemoryBlock *)0x0;
  this->blockState = 0;
  return;
}

Assistant:

void Clear()
    {
        ASSERT_THREAD();
        Assert(!lockBlockList);
        ArenaMemoryTracking::ReportFreeAll(this);

        freeList = TFreeListPolicy::Reset(freeList);
#ifdef ARENA_ALLOCATOR_FREE_LIST_SIZE
        this->freeListSize = 0;
#endif
        ReleaseMemory();
        this->cacheBlockCurrent = nullptr;
        this->cacheBlockEnd = nullptr;
        this->bigBlocks = nullptr;
        this->fullBlocks = nullptr;
        this->largestHole = 0;
        this->mallocBlocks = nullptr;
        this->blockState = 0;
    }